

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QString * __thiscall
QStyleSheetStyleSelector::attributeValue
          (QString *__return_storage_ptr__,QStyleSheetStyleSelector *this,NodePtr node,
          AttributeSelector *aSelector)

{
  Span *pSVar1;
  undefined1 *puVar2;
  PrivateShared *pPVar3;
  char16_t *pcVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  QHash<QString,_QString> *this_00;
  char *pcVar8;
  QObject *object;
  QStyleSheetStyle *this_01;
  QStyle *pQVar9;
  QString *this_02;
  ulong uVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  const_iterator cVar13;
  QByteArrayView local_b8;
  QByteArrayView local_a8;
  bool isNumber;
  undefined7 uStack_97;
  undefined1 local_78 [24];
  undefined4 uStack_60;
  undefined4 uStack_5c;
  anon_union_24_3_e3d07ef4_for_data local_58;
  ulong local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar5 = (**(code **)(*(long *)this + 0x38))(this,node.ptr);
  if (cVar5 != '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_003569c1;
  }
  local_58.shared = (PrivateShared *)node;
  this_00 = QHash<const_QObject_*,_QHash<QString,_QString>_>::operator[]
                      (&this->m_attributeCache,(QObject **)&local_58.shared);
  cVar13 = QHash<QString,_QString>::constFindImpl<QString>(this_00,&aSelector->name);
  if (cVar13.i.d == (Data<QHashPrivate::Node<QString,_QString>_> *)0x0 && cVar13.i.bucket == 0) {
    local_58._16_8_ = 0;
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_40 = 2;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    pcVar8 = (char *)(*(code *)**node.ptr)(node.ptr);
    QString::toLatin1_helper((QString *)local_78);
    iVar7 = QMetaObject::indexOfProperty(pcVar8);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_78);
    if (iVar7 != -1) {
      local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      uStack_60 = 0xaaaaaaaa;
      uStack_5c = 0xaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      (*(code *)**node.ptr)(node.ptr);
      QMetaObject::property((int)local_78);
      QMetaProperty::read((QObject *)&isNumber);
      ::QVariant::operator=((QVariant *)&local_58,(QVariant *)&isNumber);
      ::QVariant::~QVariant((QVariant *)&isNumber);
      cVar5 = QMetaProperty::isEnumType();
      if (cVar5 != '\0') {
        _isNumber = (Data *)CONCAT71(uStack_97,0xaa);
        QString::toInt(&aSelector->value,&isNumber,10);
        if (isNumber == true) {
          ::QVariant::convert((QMetaTypeInterface *)&local_58);
        }
      }
      goto LAB_003568bb;
    }
    QString::toLatin1_helper((QString *)&isNumber);
    QObject::property((char *)local_78);
    ::QVariant::operator=((QVariant *)&local_58,(QVariant *)local_78);
    ::QVariant::~QVariant((QVariant *)local_78);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&isNumber);
    if (local_40 < 4) {
      local_78._0_8_ = (Data *)0x5;
      local_78._8_8_ = "class";
      bVar6 = ::operator==(&aSelector->name,(QLatin1StringView *)local_78);
      if (bVar6) {
        local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        (*(code *)**node.ptr)(node.ptr);
        _isNumber = (Data *)QMetaObject::className();
        QByteArrayView::QByteArrayView<const_char_*,_true>(&local_a8,(char **)&isNumber);
        QVar11.m_data = (storage_type *)local_a8.m_size;
        QVar11.m_size = (qsizetype)local_78;
        QString::fromLatin1(QVar11);
        bVar6 = QString::contains((QString *)local_78,(QChar)0x3a,CaseSensitive);
        if (bVar6) {
          QString::replace((QChar)(char16_t)local_78,(QChar)0x3a,0x2d);
        }
        QString::operator=(__return_storage_ptr__,(QString *)local_78);
LAB_00356803:
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
      }
      else {
        local_78._0_8_ = (PrivateShared *)0x5;
        local_78._8_8_ = (long)"text-underline-style" + 0xf;
        bVar6 = ::operator==(&aSelector->name,(QLatin1StringView *)local_78);
        if ((bVar6) && ((*(byte *)(*(long *)((long)node.ptr + 8) + 0x30) & 1) != 0)) {
          object = &QWidget::style((QWidget *)node.ptr)->super_QObject;
          this_01 = QtPrivate::qobject_cast_helper<QStyleSheetStyle*,QObject>(object);
          if (this_01 != (QStyleSheetStyle *)0x0) {
            pQVar9 = QStyleSheetStyle::baseStyle((QStyleSheetStyle *)this_01);
            (*(code *)**(undefined8 **)pQVar9)(pQVar9);
            _isNumber = (Data *)QMetaObject::className();
            QByteArrayView::QByteArrayView<const_char_*,_true>(&local_b8,(char **)&isNumber);
            QVar12.m_data = (storage_type *)local_b8.m_size;
            QVar12.m_size = (qsizetype)local_78;
            QString::fromLatin1(QVar12);
            pPVar3 = (PrivateShared *)(__return_storage_ptr__->d).d;
            pcVar4 = (__return_storage_ptr__->d).ptr;
            (__return_storage_ptr__->d).d = (Data *)local_78._0_8_;
            (__return_storage_ptr__->d).ptr = (char16_t *)local_78._8_8_;
            puVar2 = (undefined1 *)(__return_storage_ptr__->d).size;
            (__return_storage_ptr__->d).size = local_78._16_8_;
            local_78._0_8_ = pPVar3;
            local_78._8_8_ = pcVar4;
            local_78._16_8_ = puVar2;
            goto LAB_00356803;
          }
        }
      }
LAB_003568bb:
      if (3 < local_40) goto LAB_003568ca;
    }
    else {
LAB_003568ca:
      iVar7 = ::QVariant::typeId((QVariant *)&local_58);
      if ((iVar7 == 0xb) || (iVar7 = ::QVariant::typeId((QVariant *)&local_58), iVar7 == 9)) {
        ::QVariant::toStringList();
        QListSpecialMethods<QString>::join
                  ((QString *)local_78,(QListSpecialMethods<QString> *)&isNumber,(QChar)0x20);
        pPVar3 = (PrivateShared *)(__return_storage_ptr__->d).d;
        pcVar4 = (__return_storage_ptr__->d).ptr;
        (__return_storage_ptr__->d).d = (Data *)local_78._0_8_;
        (__return_storage_ptr__->d).ptr = (char16_t *)local_78._8_8_;
        puVar2 = (undefined1 *)(__return_storage_ptr__->d).size;
        (__return_storage_ptr__->d).size = local_78._16_8_;
        local_78._0_8_ = pPVar3;
        local_78._8_8_ = pcVar4;
        local_78._16_8_ = puVar2;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&isNumber);
      }
      else {
        ::QVariant::toString();
        pPVar3 = (PrivateShared *)(__return_storage_ptr__->d).d;
        pcVar4 = (__return_storage_ptr__->d).ptr;
        (__return_storage_ptr__->d).d = (Data *)local_78._0_8_;
        (__return_storage_ptr__->d).ptr = (char16_t *)local_78._8_8_;
        puVar2 = (undefined1 *)(__return_storage_ptr__->d).size;
        (__return_storage_ptr__->d).size = local_78._16_8_;
        local_78._0_8_ = pPVar3;
        local_78._8_8_ = pcVar4;
        local_78._16_8_ = puVar2;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
      }
    }
    this_02 = QHash<QString,_QString>::operator[](this_00,&aSelector->name);
    QString::operator=(this_02,(QString *)__return_storage_ptr__);
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  else {
    pSVar1 = (cVar13.i.d)->spans;
    uVar10 = cVar13.i.bucket >> 7;
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&__return_storage_ptr__->d,
               (QArrayDataPointer<char16_t> *)
               (pSVar1[uVar10].entries[pSVar1[uVar10].offsets[(uint)cVar13.i.bucket & 0x7f]].storage
                .data + 0x18));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_003569c1:
  __stack_chk_fail();
}

Assistant:

QString attributeValue(NodePtr node, const QCss::AttributeSelector& aSelector) const override
    {
        if (isNullNode(node))
            return QString();

        const QString &name = aSelector.name;
        QHash<QString, QString> &cache = m_attributeCache[OBJECT_PTR(node)];
        QHash<QString, QString>::const_iterator cacheIt = cache.constFind(name);
        if (cacheIt != cache.constEnd())
            return cacheIt.value();

        QVariant value;
        QString valueStr;
        QObject *obj = OBJECT_PTR(node);
        const int propertyIndex = obj->metaObject()->indexOfProperty(name.toLatin1());
        if (propertyIndex == -1) {
            value = obj->property(name.toLatin1()); // might be a dynamic property
            if (!value.isValid()) {
                if (name == "class"_L1) {
                    QString className = QString::fromLatin1(obj->metaObject()->className());
                    if (className.contains(u':'))
                        className.replace(u':', u'-');
                    valueStr = className;
                } else if (name == "style"_L1) {
                    QWidget *w = qobject_cast<QWidget *>(obj);
                    QStyleSheetStyle *proxy = w ? qt_styleSheet(w->style()) : nullptr;
                    if (proxy)
                        valueStr = QString::fromLatin1(proxy->baseStyle()->metaObject()->className());
                }
            }
        } else {
            const QMetaProperty property = obj->metaObject()->property(propertyIndex);
            value = property.read(obj);
            // support Qt 5 selector syntax, which required the integer enum value
            if (property.isEnumType()) {
                bool isNumber;
                aSelector.value.toInt(&isNumber);
                if (isNumber)
                    value.convert(QMetaType::fromType<int>());
            }
        }
        if (value.isValid()) {
            valueStr = (value.userType() == QMetaType::QStringList
                        || value.userType() == QMetaType::QVariantList)
                        ? value.toStringList().join(u' ')
                        : value.toString();
        }
        cache[name] = valueStr;
        return valueStr;
    }